

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack30_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  auVar8 = *(undefined1 (*) [32])(in + 1);
  uVar1 = *in;
  *out = uVar1 & 0x3fffffff;
  uVar2 = *(ulong *)(in + 0xd);
  auVar7 = valignd_avx512vl(auVar8,auVar8,7);
  auVar7 = vpblendd_avx2(auVar7,ZEXT432(uVar1),1);
  auVar5 = *(undefined1 (*) [16])(in + 5);
  auVar8 = vpshldvd_avx512_vbmi2(auVar8,auVar7,_DAT_00193d60);
  auVar9._8_4_ = 0x3fffffff;
  auVar9._0_8_ = 0x3fffffff3fffffff;
  auVar9._12_4_ = 0x3fffffff;
  auVar7._16_4_ = 0x3fffffff;
  auVar7._0_16_ = auVar9;
  auVar7._20_4_ = 0x3fffffff;
  auVar7._24_4_ = 0x3fffffff;
  auVar7._28_4_ = 0x3fffffff;
  auVar8 = vpand_avx2(auVar8,auVar7);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar6 = *(undefined1 (*) [16])(in + 9);
  auVar5 = vpalignr_avx(auVar6,auVar5,0xc);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar2;
  auVar3 = vpalignr_avx(auVar10,auVar6,0xc);
  auVar5 = vpshldvd_avx512_vbmi2(auVar6,auVar5,_DAT_00196f00);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001972e0);
  auVar5 = vpand_avx(auVar5,auVar9);
  auVar6 = vpsllvd_avx2(auVar10,_DAT_00199530);
  auVar4._8_8_ = 0x300000003c000000;
  auVar4._0_8_ = 0x300000003c000000;
  auVar6 = vpternlogq_avx512vl(auVar6,auVar3,auVar4,0xec);
  *(undefined1 (*) [16])(out + 9) = auVar5;
  *(long *)(out + 0xd) = auVar6._0_8_;
  out[0xf] = (uint)(uVar2 >> 0x22);
  return in + 0xf;
}

Assistant:

const uint32_t *__fastunpack30_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 28)) << (30 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 26)) << (30 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 24)) << (30 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 22)) << (30 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 20)) << (30 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 18)) << (30 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 16)) << (30 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 14)) << (30 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 12)) << (30 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 10)) << (30 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 8)) << (30 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 6)) << (30 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 4)) << (30 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  *out |= ((*in) % (1U << 2)) << (30 - 2);
  out++;
  *out = ((*in) >> 2);
  ++in;
  out++;

  return in;
}